

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O1

void __thiscall
tst_deprecations_helpers_qpromiseall::preserveOrder(tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  int *piVar2;
  PromiseData<int> *pPVar3;
  long lVar4;
  long *plVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar6;
  bool bVar7;
  char cVar8;
  QPromise<int> *data;
  char *pcVar9;
  char *pcVar10;
  const_iterator expectedBegin;
  ulong uVar11;
  long lVar12;
  QArrayData *d;
  QPromise<int> *pQStack_b0;
  long local_a8 [2];
  QList<int> local_98;
  PromiseData<int> *local_80;
  undefined **local_78;
  PromiseData<int> *local_70;
  QPromise<int> p2;
  QPromise<int> p1;
  QPromise<int> p0;
  QPromise<QList<int>_> p;
  QArrayData *d_1;
  
  d = (QArrayData *)CONCAT44(d._4_4_,0x2a);
  QtPromise::resolve<int>((QtPromise *)&local_98,(int *)&d);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p0.super_QPromiseBase<int>,(anon_class_4_1_898ef5c2)(int)(QtPromise *)&local_98);
  local_98.d.d = (Data *)&PTR__QPromiseBase_0012d920;
  if ((long *)local_98.d.ptr != (long *)0x0) {
    LOCK();
    plVar5 = (long *)((long)local_98.d.ptr + 8);
    *(int *)plVar5 = (int)*plVar5 + -1;
    UNLOCK();
    if (((int)*plVar5 == 0) && ((long *)local_98.d.ptr != (long *)0x0)) {
      (**(code **)(*(long *)local_98.d.ptr + 8))();
    }
  }
  d = (QArrayData *)CONCAT44(d._4_4_,0x2b);
  QtPromise::resolve<int>((QtPromise *)&local_98,(int *)&d);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p1.super_QPromiseBase<int>,(anon_class_4_1_898ef5c2)(int)&local_98);
  local_98.d.d = (Data *)&PTR__QPromiseBase_0012d920;
  if ((long *)local_98.d.ptr != (long *)0x0) {
    LOCK();
    plVar5 = (long *)((long)local_98.d.ptr + 8);
    *(int *)plVar5 = (int)*plVar5 + -1;
    UNLOCK();
    if (((int)*plVar5 == 0) && ((long *)local_98.d.ptr != (long *)0x0)) {
      (**(code **)(*(long *)local_98.d.ptr + 8))();
    }
  }
  d = (QArrayData *)CONCAT44(d._4_4_,0x2c);
  QtPromise::resolve<int>((QtPromise *)&local_98,(int *)&d);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&p2.super_QPromiseBase<int>,(anon_class_4_1_898ef5c2)(int)&local_98);
  local_98.d.d = (Data *)&PTR__QPromiseBase_0012d920;
  if ((long *)local_98.d.ptr != (long *)0x0) {
    LOCK();
    plVar5 = (long *)((long)local_98.d.ptr + 8);
    *(int *)plVar5 = (int)*plVar5 + -1;
    UNLOCK();
    if (((int)*plVar5 == 0) && ((long *)local_98.d.ptr != (long *)0x0)) {
      (**(code **)(*(long *)local_98.d.ptr + 8))();
    }
  }
  local_98.d.ptr = (int *)p0.super_QPromiseBase<int>.m_d.d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.d = (Data *)&PTR__QPromiseBase_0012dbc0;
  local_80 = p1.super_QPromiseBase<int>.m_d.d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.d.size = (qsizetype)&PTR__QPromiseBase_0012dbc0;
  local_70 = p2.super_QPromiseBase<int>.m_d.d;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78 = &PTR__QPromiseBase_0012dbc0;
  pQStack_b0 = (QPromise<int> *)QArrayData::allocate(&d,0x10,8,3,KeepSize);
  local_a8[0] = 0;
  uVar11 = 0xfffffffffffffff0;
  do {
    pQStack_b0[local_a8[0]].super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_0012d920;
    pPVar3 = *(PromiseData<int> **)((long)&local_80 + uVar11);
    pQStack_b0[local_a8[0]].super_QPromiseBase<int>.m_d.d = pPVar3;
    if (pPVar3 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar3->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar12 = local_a8[0] + 1;
    pQStack_b0[local_a8[0]].super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_0012dbc0;
    uVar11 = uVar11 + 0x10;
    local_a8[0] = lVar12;
  } while (uVar11 < 0x20);
  QtPromise::all<int,_QList>((QtPromise *)&p,(QList<QtPromise::QPromise<int>_> *)&d);
  QArrayDataPointer<QtPromise::QPromise<int>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<int>_> *)&d);
  lVar12 = 0x30;
  do {
    *(undefined ***)((long)local_a8 + lVar12) = &PTR__QPromiseBase_0012d920;
    lVar4 = *(long *)((long)local_a8 + lVar12 + 8);
    if (lVar4 != 0) {
      LOCK();
      piVar2 = (int *)(lVar4 + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) &&
         (plVar5 = *(long **)((long)local_a8 + lVar12 + 8), plVar5 != (long *)0x0)) {
        (**(code **)(*plVar5 + 8))();
      }
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,bVar7);
  d = (QArrayData *)CONCAT71(d._1_7_,1);
  pcVar9 = QTest::toString<bool>((bool *)&local_98);
  pcVar10 = QTest::toString<bool>((bool *)&d);
  cVar8 = QTest::compare_helper
                    (bVar7,"Compared values are not the same",pcVar9,pcVar10,"p0.isPending()","true"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xbf);
  if (cVar8 != '\0') {
    bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,bVar7);
    d = (QArrayData *)CONCAT71(d._1_7_,1);
    pcVar9 = QTest::toString<bool>((bool *)&local_98);
    pcVar10 = QTest::toString<bool>((bool *)&d);
    cVar8 = QTest::compare_helper
                      (bVar7,"Compared values are not the same",pcVar9,pcVar10,"p1.isPending()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0xc0);
    if (cVar8 != '\0') {
      bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (&(p2.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,bVar7);
      d = (QArrayData *)CONCAT71(d._1_7_,1);
      pcVar9 = QTest::toString<bool>((bool *)&local_98);
      pcVar10 = QTest::toString<bool>((bool *)&d);
      cVar8 = QTest::compare_helper
                        (bVar7,"Compared values are not the same",pcVar9,pcVar10,"p2.isPending()",
                         "true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0xc1);
      if (cVar8 != '\0') {
        bVar7 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                          (&(p.super_QPromiseBase<QList<int>_>.m_d.d)->
                            super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
        local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,bVar7);
        d = (QArrayData *)CONCAT71(d._1_7_,1);
        pcVar9 = QTest::toString<bool>((bool *)&local_98);
        pcVar10 = QTest::toString<bool>((bool *)&d);
        cVar8 = QTest::compare_helper
                          (bVar7,"Compared values are not the same",pcVar9,pcVar10,"p.isPending()",
                           "true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc2);
        if (cVar8 != '\0') {
          d = (QArrayData *)0x0;
          pQStack_b0 = (QPromise<int> *)0x0;
          local_a8[0] = 0;
          waitForValue<QList<int>>(&local_98,&p,(QList<int> *)&d);
          expectedBegin.i = (int *)QArrayData::allocate(&d_1,4,8,3,KeepSize);
          expectedBegin.i[0] = 0x2a;
          expectedBegin.i[1] = 0x2b;
          expectedBegin.i[2] = 0x2c;
          bVar7 = QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                            ((const_iterator)local_98.d.ptr,
                             (const_iterator)(local_98.d.ptr + local_98.d.size),expectedBegin,
                             (const_iterator)(expectedBegin.i + 3),"waitForValue(p, QVector<int>{})"
                             ,"(QVector<int>{42, 43, 44})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                             ,0xc3);
          if (d_1 != (QArrayData *)0x0) {
            LOCK();
            (d_1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (d_1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((d_1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(d_1,4,8);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,8);
            }
          }
          if (d != (QArrayData *)0x0) {
            LOCK();
            (d->ref_)._q_value.super___atomic_base<int>._M_i =
                 (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(d,4,8);
            }
          }
          QVar6.d = p0.super_QPromiseBase<int>.m_d.d;
          if (bVar7) {
            bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                              (&(p0.super_QPromiseBase<int>.m_d.d)->
                                super_PromiseDataBase<int,_void_(const_int_&)>);
            bVar7 = (bool)(~bVar7 & ((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                                    m_error.m_data._M_exception_object == (void *)0x0);
            local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,bVar7);
            d = (QArrayData *)CONCAT71(d._1_7_,1);
            pcVar9 = QTest::toString<bool>((bool *)&local_98);
            pcVar10 = QTest::toString<bool>((bool *)&d);
            cVar8 = QTest::compare_helper
                              (bVar7,"Compared values are not the same",pcVar9,pcVar10,
                               "p0.isFulfilled()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                               ,0xc4);
            QVar6 = p1.super_QPromiseBase<int>.m_d;
            if (cVar8 != '\0') {
              bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                                (&(p1.super_QPromiseBase<int>.m_d.d)->
                                  super_PromiseDataBase<int,_void_(const_int_&)>);
              local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,
                                              ~bVar7 & ((QVar6.d)->
                                                                                                              
                                                  super_PromiseDataBase<int,_void_(const_int_&)>).
                                                  m_error.m_data._M_exception_object == (void *)0x0)
              ;
              d = (QArrayData *)CONCAT71(d._1_7_,1);
              bVar7 = QTest::qCompare<bool,bool>
                                ((bool *)&local_98,(bool *)&d,"p1.isFulfilled()","true",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                 ,0xc5);
              QVar6 = p2.super_QPromiseBase<int>.m_d;
              if (bVar7) {
                bVar7 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                                  (&(p2.super_QPromiseBase<int>.m_d.d)->
                                    super_PromiseDataBase<int,_void_(const_int_&)>);
                local_98.d.d = (Data *)CONCAT71(local_98.d.d._1_7_,
                                                ~bVar7 & ((QVar6.d)->
                                                                                                                  
                                                  super_PromiseDataBase<int,_void_(const_int_&)>).
                                                  m_error.m_data._M_exception_object == (void *)0x0)
                ;
                d = (QArrayData *)CONCAT71(d._1_7_,1);
                QTest::qCompare<bool,bool>
                          ((bool *)&local_98,(bool *)&d,"p2.isFulfilled()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0xc6);
              }
            }
          }
        }
      }
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d8c0;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  p2.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p2.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p2.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::preserveOrder()
{
    auto p0 = QtPromise::resolve(42).delay(500);
    auto p1 = QtPromise::resolve(43).delay(100);
    auto p2 = QtPromise::resolve(44).delay(250);

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p1, p2});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isFulfilled(), true);
}